

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O2

void Bmc_BmciUnfold(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vFFLits,int fPiReuse)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = p->nRegs;
  if (iVar6 != vFFLits->nSize) {
    __assert_fail("Gia_ManRegNum(p) == Vec_IntSize(vFFLits)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                  ,0x5f,"void Bmc_BmciUnfold(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int)");
  }
  p->pObjs->Value = 0;
  iVar5 = 0;
  while ((iVar5 < iVar6 &&
         (pGVar2 = Gia_ManCi(p,(p->vCis->nSize - iVar6) + iVar5), pGVar2 != (Gia_Obj_t *)0x0))) {
    uVar1 = Vec_IntEntry(vFFLits,iVar5);
    pGVar2->Value = uVar1;
    iVar5 = iVar5 + 1;
    iVar6 = p->nRegs;
  }
  iVar6 = 0;
  while ((iVar6 < p->vCis->nSize - p->nRegs &&
         (pGVar2 = Gia_ManCi(p,iVar6), pGVar2 != (Gia_Obj_t *)0x0))) {
    if (fPiReuse == 0) {
      uVar1 = Gia_ManAppendCi(pNew);
    }
    else {
      iVar5 = pNew->vCis->nSize;
      iVar4 = (((iVar5 + p->nRegs) - pNew->nRegs) - p->vCis->nSize) + iVar6;
      if (iVar5 - pNew->nRegs <= iVar4) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      pGVar3 = Gia_ManCi(pNew,iVar4);
      iVar5 = Gia_ObjId(pNew,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe));
      uVar1 = Abc_Var2Lit(iVar5,(uint)pGVar3 & 1);
    }
    pGVar2->Value = uVar1;
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  while ((iVar6 < p->nObjs && (pGVar2 = Gia_ManObj(p,iVar6), pGVar2 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
      iVar5 = Gia_ObjFanin0Copy(pGVar2);
      uVar1 = (uint)((ulong)*(undefined8 *)pGVar2 >> 0x20);
      iVar4 = Abc_LitNotCond(pGVar2[-(ulong)(uVar1 & 0x1fffffff)].Value,uVar1 >> 0x1d & 1);
      uVar1 = Gia_ManHashAnd(pNew,iVar5,iVar4);
      pGVar2->Value = uVar1;
    }
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  while( true ) {
    if (p->nRegs <= iVar6) {
      return;
    }
    iVar5 = Vec_IntEntry(p->vCos,(p->vCos->nSize - p->nRegs) + iVar6);
    pGVar2 = Gia_ManObj(p,iVar5);
    if (pGVar2 == (Gia_Obj_t *)0x0) break;
    iVar5 = Gia_ObjFanin0Copy(pGVar2);
    Vec_IntWriteEntry(vFFLits,iVar6,iVar5);
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

void Bmc_BmciUnfold( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vFFLits, int fPiReuse )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == Vec_IntSize(vFFLits) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Vec_IntEntry(vFFLits, i);
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = fPiReuse ? Gia_ObjToLit(pNew, Gia_ManPi(pNew, Gia_ManPiNum(pNew)-Gia_ManPiNum(p)+i)) : Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        Vec_IntWriteEntry( vFFLits, i, Gia_ObjFanin0Copy(pObj) );
}